

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

wchar_t count_chests(loc_conflict *grid,chest_query check_type)

{
  loc_conflict grid_00;
  object *poVar1;
  loc_conflict grid1;
  wchar_t count;
  wchar_t d;
  chest_query check_type_local;
  loc_conflict *grid_local;
  
  grid1.x = L'\0';
  for (grid1.y = L'\0'; grid1.y < L'\t'; grid1.y = grid1.y + L'\x01') {
    grid_00 = (loc_conflict)loc_sum(player->grid,ddgrid_ddd[grid1.y]);
    poVar1 = chest_check(player,grid_00,check_type);
    if (poVar1 != (object *)0x0) {
      grid1.x = grid1.x + L'\x01';
      *grid = grid_00;
    }
  }
  return grid1.x;
}

Assistant:

int count_chests(struct loc *grid, enum chest_query check_type)
{
	int d, count;

	/* Count how many matches */
	count = 0;

	/* Check around (and under) the character */
	for (d = 0; d < 9; d++) {
		/* Extract adjacent (legal) location */
		struct loc grid1 = loc_sum(player->grid, ddgrid_ddd[d]);

		/* No (visible) chest is there */
		if (!chest_check(player, grid1, check_type)) continue;

		/* Count it */
		++count;

		/* Remember the location of the last chest found */
		*grid = grid1;
	}

	/* All done */
	return count;
}